

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

void __thiscall diy::FileStorage::get(FileStorage *this,int i,void *x,Load *load)

{
  int __fd;
  char *__file;
  FILE *in_RCX;
  FileBuffer *in_RDI;
  FileBuffer fb;
  int fh;
  FileRecord fr;
  undefined4 in_stack_ffffffffffffff78;
  function<void_(void_*,_diy::BinaryBuffer_&)> *in_stack_ffffffffffffff80;
  FILE *in_stack_ffffffffffffff88;
  FileStorage *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffc4;
  FileStorage *in_stack_ffffffffffffffc8;
  
  extract_file_record(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  __file = (char *)std::__cxx11::string::c_str();
  __fd = open(__file,0,0x180);
  fdopen(__fd,"r");
  detail::FileBuffer::FileBuffer(in_RDI,in_RCX);
  std::function<void_(void_*,_diy::BinaryBuffer_&)>::operator()
            (in_stack_ffffffffffffff80,(void *)CONCAT44(__fd,in_stack_ffffffffffffff78),
             &in_RDI->super_BinaryBuffer);
  fclose(in_stack_ffffffffffffff88);
  remove_file(in_stack_ffffffffffffff90,(FileRecord *)in_stack_ffffffffffffff88);
  detail::FileBuffer::~FileBuffer((FileBuffer *)0x1234ed);
  FileRecord::~FileRecord((FileRecord *)0x1234f7);
  return;
}

Assistant:

virtual void   get(int i, void* x, detail::Load load) override
      {
        FileRecord fr = extract_file_record(i);

        //int fh = open(fr.name.c_str(), O_RDONLY | O_SYNC, 0600);
#if defined(_WIN32)
        int fh = -1;
        _sopen_s(&fh, fr.name.c_str(), _O_RDONLY | _O_BINARY, _SH_DENYNO, _S_IREAD);
        detail::FileBuffer fb(_fdopen(fh, "rb"));
#else
        int fh = open(fr.name.c_str(), O_RDONLY, 0600);
        detail::FileBuffer fb(fdopen(fh, "r"));
#endif
        load(x, fb);
        fclose(fb.file);

        remove_file(fr);
      }